

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O0

int Datetime::dayOfWeek(string *input)

{
  bool bVar1;
  size_type sVar2;
  reference reference;
  uint local_1c;
  uint i;
  string *input_local;
  
  if (minimumMatchLength == 0) {
    minimumMatchLength = 3;
  }
  local_1c = 0;
  while( true ) {
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&dayNames_abi_cxx11_);
    if (sVar2 <= local_1c) {
      return -1;
    }
    reference = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](&dayNames_abi_cxx11_,(ulong)local_1c);
    bVar1 = closeEnough(reference,input,minimumMatchLength);
    if (bVar1) break;
    local_1c = local_1c + 1;
  }
  return local_1c;
}

Assistant:

int Datetime::dayOfWeek (const std::string& input)
{
  if (Datetime::minimumMatchLength== 0)
    Datetime::minimumMatchLength = 3;

  for (unsigned int i = 0; i < dayNames.size (); ++i)
    if (closeEnough (dayNames[i], input, Datetime::minimumMatchLength))
       return i;

  return -1;
}